

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void PrintMap<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *d)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  
  for (p_Var1 = (d->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&p_Var1[5]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void PrintMap(T &d)
{
    for(auto &&e : d)
    {
        cout << e.first << " " << e.second << ",";
    }

    cout << endl;
}